

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int archive_read_format_7zip_read_header(archive_read *a,archive_entry *entry)

{
  uint32_t **ppuVar1;
  _7z_coders_info *val;
  uint *puVar2;
  _7z_stream_info *si;
  uint64_t uVar3;
  _7z_stream_info *si_00;
  size_t sVar4;
  uchar uVar5;
  wchar_t wVar6;
  int iVar7;
  int iVar8;
  uchar *p;
  int64_t iVar9;
  uint64_t *puVar10;
  uint32_t *puVar11;
  archive_string_conv *paVar12;
  int *piVar13;
  char *pcVar14;
  uchar *puVar15;
  undefined8 extraout_RAX;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  void *pvVar19;
  uchar *puVar20;
  long lVar21;
  _7z_coder *p_Var22;
  _7z_coder *p_Var23;
  char *pcVar24;
  long lVar25;
  size_t b;
  _7z_folder *p_Var26;
  size_t rbytes;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint64_t uVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  _7z_folder *p_Var34;
  char *pcVar35;
  long lVar36;
  uint uVar37;
  ulong uVar38;
  bool bVar39;
  uint64_t *local_a0;
  size_t local_90;
  uint64_t size;
  _7z_folder *local_70;
  undefined4 local_64;
  int64_t offset;
  _7z_header_info header;
  
  si = (_7z_stream_info *)a->format->data;
  if ((int)si[0xc6].ci.numFolders == -1) {
    *(undefined4 *)&si[0xc6].ci.numFolders = 0;
  }
  (a->archive).archive_format = 0xe0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "7-Zip";
  }
  if (si[1].ci.folders != (_7z_folder *)0x0) {
    puVar10 = si[1].pi.positions;
    p_Var34 = (_7z_folder *)(si[1].ci.dataStreamIndex + 0x58);
    goto LAB_001590b9;
  }
  header.emptyFileBools = (uchar *)0x0;
  header.antiBools = (uchar *)0x0;
  header.dataIndex = 0;
  header.emptyStreamBools = (uchar *)0x0;
  header.attrBools = (uchar *)0x0;
  piVar13 = (int *)__archive_read_ahead(a,0x20,&offset);
  iVar8 = -0x1e;
  if (piVar13 == (int *)0x0) {
LAB_00159069:
    bVar39 = false;
  }
  else {
    if ((((char)*piVar13 == 'M') && (*(char *)((long)piVar13 + 1) == 'Z')) ||
       (*piVar13 == 0x464c457f)) {
      if (offset < 0x27001) {
        iVar9 = __archive_read_seek(a,0x27000,0);
        if (iVar9 < 0) goto LAB_00159069;
      }
      else {
        __archive_read_consume(a,0x27000);
      }
      lVar36 = 0;
      uVar38 = 1;
      do {
        while( true ) {
          uVar18 = uVar38;
          if (0x39000 < uVar18 + lVar36) goto LAB_00158fa7;
          pcVar24 = (char *)__archive_read_ahead(a,uVar18,(ssize_t *)&size);
          if (pcVar24 == (char *)0x0) break;
          uVar38 = 0x1000;
          if (5 < (long)size) {
            pcVar35 = pcVar24 + size;
            for (pcVar14 = pcVar24; pcVar14 + 0x20 < pcVar35; pcVar14 = pcVar14 + uVar28) {
              uVar28 = check_7zip_header_in_sfx(pcVar14);
              if (uVar28 == 0) {
                pvVar19 = a->format->data;
                __archive_read_consume(a,(long)pcVar14 - (long)pcVar24);
                *(long *)((long)pvVar19 + 0x88) = lVar36 + ((long)pcVar14 - (long)pcVar24) + 0x27000
                ;
                piVar13 = (int *)__archive_read_ahead(a,0x20,&offset);
                iVar8 = -0x1e;
                if (piVar13 != (int *)0x0) goto LAB_00158e91;
                goto LAB_00159069;
              }
            }
            __archive_read_consume(a,(long)pcVar14 - (long)pcVar24);
            lVar36 = lVar36 + ((long)pcVar14 - (long)pcVar24);
            uVar38 = uVar18;
            if (uVar18 == 1) {
              uVar38 = 0x1000;
            }
          }
        }
        uVar38 = uVar18 >> 1;
      } while (0x7f < uVar18);
LAB_00158fa7:
      archive_set_error(&a->archive,0x54,"Couldn\'t find out 7-Zip header");
      iVar8 = -0x1e;
      goto LAB_00159069;
    }
LAB_00158e91:
    iVar8 = -0x1e;
    ppuVar1 = &si[1].pi.digest.digests;
    *ppuVar1 = *ppuVar1 + 8;
    iVar7 = bcmp(piVar13,anon_var_dwarf_4e169,6);
    if (iVar7 != 0) {
      pcVar24 = "Not 7-Zip archive file";
LAB_0015905a:
      archive_set_error(&a->archive,-1,pcVar24);
      goto LAB_00159069;
    }
    uVar38 = crc32(0,piVar13 + 3,0x14);
    if (uVar38 != (uint)piVar13[2]) {
      pcVar24 = "Header CRC error";
      goto LAB_0015905a;
    }
    uVar30 = *(uint64_t *)(piVar13 + 5);
    if (uVar30 == 0) {
      iVar8 = 1;
      goto LAB_00159069;
    }
    puVar10 = *(uint64_t **)(piVar13 + 3);
    if ((long)puVar10 < 0) {
LAB_00159f6a:
      pcVar24 = "Malformed 7-Zip archive";
LAB_00159f79:
      archive_set_error(&a->archive,-1,pcVar24);
LAB_00159f85:
      bVar39 = false;
      iVar8 = -0x1e;
    }
    else {
      local_a0 = (uint64_t *)(ulong)(uint)piVar13[7];
      __archive_read_consume(a,0x20);
      if (puVar10 != (uint64_t *)0x0) {
        if ((long)puVar10 <= offset) {
          __archive_read_consume(a,(int64_t)puVar10);
          goto LAB_0015947f;
        }
        iVar9 = __archive_read_seek(a,(long)si[1].pi.digest.digests + (long)puVar10,0);
        if (-1 < iVar9) goto LAB_0015947f;
        goto LAB_00159f85;
      }
LAB_0015947f:
      si[2].pi.positions = puVar10;
      si[1].pi.digest.defineds = (uchar *)puVar10;
      si[1].pi.numPackStreams = uVar30;
      si[1].pi.sizes = (uint64_t *)0x0;
      si[1].pi.pos = 1;
      *(undefined4 *)&si[0xc6].ci.numFolders = 0;
      puVar15 = header_bytes(a,1);
      if (puVar15 == (uchar *)0x0) {
        archive_set_error(&a->archive,0x54,"Truncated 7-Zip file body");
        goto LAB_00159f85;
      }
      iVar8 = -0x1e;
      if (*puVar15 == '\x17') {
        pvVar19 = a->format->data;
        piVar13 = __errno_location();
        *piVar13 = 0;
        iVar8 = read_StreamsInfo(a,si);
        if (iVar8 < 0) {
          pcVar24 = "Malformed 7-Zip archive";
          if (*piVar13 == 0xc) {
            pcVar24 = "Couldn\'t allocate memory";
          }
LAB_00159600:
          archive_set_error(&a->archive,-1,pcVar24);
          iVar8 = -0x1e;
LAB_00159613:
          bVar39 = true;
        }
        else {
          pcVar24 = "Malformed 7-Zip archive";
          if (((si->pi).numPackStreams == 0) || ((si->ci).numFolders == 0)) goto LAB_00159600;
          uVar30 = (si->pi).pos;
          pcVar24 = "Malformed Header offset";
          if ((((long)uVar30 < 0) ||
              ((uVar3 = *(si->pi).sizes, uVar3 == 0 ||
               (uVar38 = uVar3 + uVar30, *(ulong *)((long)pvVar19 + 0x80) < uVar38)))) ||
             ((long)uVar38 < 0)) goto LAB_00159600;
          if (si[1].pi.sizes != local_a0) {
            iVar8 = -1;
            archive_set_error(&a->archive,-1,"Damaged 7-Zip archive");
            goto LAB_00159613;
          }
          p_Var34 = (si->ci).folders;
          bVar39 = p_Var34->digest_defined != '\0';
          if (bVar39) {
            local_a0 = (uint64_t *)(ulong)p_Var34->digest;
          }
          if (si[2].ss.unpackSizes != (uint64_t *)0x0) {
            read_consume(a);
            p_Var34 = (si->ci).folders;
          }
          iVar8 = setup_decode_folder(a,p_Var34,1);
          if (iVar8 == 0) {
            si[1].pi.numPackStreams = (uint64_t)si[2].ci.folders;
            iVar8 = seek_pack(a);
          }
        }
        free_StreamsInfo(si);
        (si->ss).unpackSizes = (uint64_t *)0x0;
        (si->ss).digestsDefined = (uchar *)0x0;
        (si->ci).dataStreamIndex = 0;
        (si->ss).unpack_streams = 0;
        (si->ci).numFolders = 0;
        (si->ci).folders = (_7z_folder *)0x0;
        (si->pi).digest.digests = (uint32_t *)0x0;
        (si->pi).positions = (uint64_t *)0x0;
        (si->pi).sizes = (uint64_t *)0x0;
        (si->pi).digest.defineds = (uchar *)0x0;
        (si->pi).pos = 0;
        (si->pi).numPackStreams = 0;
        (si->ss).digests = (uint32_t *)0x0;
        if (-1 < iVar8) {
          *(undefined4 *)((long)&si[1].pi.pos + 4) = 1;
          si[1].pi.sizes = (uint64_t *)0x0;
          local_64 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),!bVar39);
          goto LAB_00159669;
        }
        goto LAB_00159f85;
      }
      if (*puVar15 == '\x01') {
        local_64 = 0;
        piVar13 = __errno_location();
LAB_00159669:
        *piVar13 = 0;
        si_00 = (_7z_stream_info *)a->format->data;
        if (((*(int *)((long)&si[1].pi.pos + 4) == 0) ||
            ((puVar15 = header_bytes(a,1), puVar15 != (uchar *)0x0 && (*puVar15 == '\x01')))) &&
           (puVar15 = header_bytes(a,1), puVar15 != (uchar *)0x0)) {
          uVar5 = *puVar15;
          if (uVar5 == '\x02') {
            do {
              puVar15 = header_bytes(a,1);
              if (puVar15 == (uchar *)0x0) break;
              if (*puVar15 == '\0') {
                puVar15 = header_bytes(a,1);
                if (puVar15 != (uchar *)0x0) {
                  uVar5 = *puVar15;
                  goto LAB_00159717;
                }
                break;
              }
              iVar8 = parse_7zip_uint64(a,&size);
            } while (-1 < iVar8);
          }
          else {
LAB_00159717:
            if (uVar5 == '\x04') {
              iVar8 = read_StreamsInfo(a,si_00);
              if ((iVar8 < 0) || (puVar15 = header_bytes(a,1), puVar15 == (uchar *)0x0))
              goto LAB_00159d20;
              uVar5 = *puVar15;
            }
            if (uVar5 == '\0') {
LAB_00159f52:
              puVar15 = header_bytes(a,1);
              if ((puVar15 == (uchar *)0x0) || (*puVar15 != '\0')) goto LAB_00159f6a;
              if (((char)local_64 == '\0') && (si[1].pi.sizes != local_a0)) {
                pcVar24 = "Malformed 7-Zip archive";
                goto LAB_00159f79;
              }
              si[2].pi.digest.digests = (uint32_t *)0x0;
              si[2].ss.unpackSizes = (uint64_t *)0x0;
              *(undefined4 *)&si[1].pi.pos = 0;
              si[2].ci.folders = (_7z_folder *)0x0;
              si[2].ci.dataStreamIndex = 0;
              iVar8 = 0;
              bVar39 = true;
              goto LAB_0015906e;
            }
            if (uVar5 == '\x05') {
              val = &si_00[1].ci;
              iVar8 = parse_7zip_uint64(a,&val->numFolders);
              if ((-1 < iVar8) && (val->numFolders < 0xf4241)) {
                local_70 = (_7z_folder *)calloc(val->numFolders,0x58);
                si_00[1].ci.folders = local_70;
                if (local_70 != (_7z_folder *)0x0) {
                  local_90 = 0;
                  do {
                    puVar15 = header_bytes(a,1);
                    if (puVar15 == (uchar *)0x0) break;
                    uVar5 = *puVar15;
                    if (uVar5 == '\0') {
                      p_Var34 = (si_00->ci).folders;
                      uVar28 = 0;
                      uVar33 = 0;
                      uVar31 = 0;
                      iVar8 = 0;
                      iVar7 = 0;
                      goto LAB_00159d73;
                    }
                    iVar8 = parse_7zip_uint64(a,&size);
                    uVar30 = size;
                    if ((iVar8 < 0) || (si_00[1].pi.numPackStreams < size)) break;
                    switch(uVar5) {
                    case '\x0e':
                      sVar4 = val->numFolders;
                      puVar15 = (uchar *)calloc(sVar4,1);
                      header.emptyStreamBools = puVar15;
                      if ((puVar15 == (uchar *)0x0) ||
                         (iVar8 = read_Bools(a,puVar15,sVar4), iVar8 < 0)) goto LAB_00159d20;
                      local_90 = 0;
                      for (uVar28 = 0; (ulong)uVar28 < val->numFolders; uVar28 = uVar28 + 1) {
                        local_90 = (size_t)(((int)local_90 + 1) - (uint)(puVar15[uVar28] == '\0'));
                      }
                      break;
                    case '\x0f':
                      if ((int)local_90 < 1) goto switchD_00159825_default;
                      puVar15 = (uchar *)calloc(local_90,1);
                      header.emptyFileBools = puVar15;
LAB_00159ba0:
                      if ((puVar15 == (uchar *)0x0) ||
                         (iVar8 = read_Bools(a,puVar15,local_90), iVar8 < 0)) goto LAB_00159d20;
                      break;
                    case '\x10':
                      if (0 < (int)local_90) {
                        puVar15 = (uchar *)calloc(local_90,1);
                        header.antiBools = puVar15;
                        goto LAB_00159ba0;
                      }
                    default:
switchD_00159825_default:
                      puVar15 = header_bytes(a,size);
                      if (puVar15 == (uchar *)0x0) goto LAB_00159d20;
                      break;
                    case '\x11':
                      puVar15 = header_bytes(a,1);
                      if (((puVar15 == (uchar *)0x0) || (uVar38 = uVar30 - 1, (uVar38 & 1) != 0)) ||
                         (uVar38 < val->numFolders << 2)) goto LAB_00159d20;
                      pvVar19 = malloc(uVar38);
                      si_00[1].ss.unpack_streams = (size_t)pvVar19;
                      uVar18 = uVar38;
                      if (pvVar19 == (void *)0x0) goto LAB_00159d20;
                      for (; uVar18 != 0; uVar18 = uVar18 - rbytes) {
                        rbytes = 0x10000;
                        if (uVar18 < 0x10000) {
                          rbytes = uVar18;
                        }
                        puVar15 = header_bytes(a,rbytes);
                        if (puVar15 == (uchar *)0x0) goto LAB_00159d20;
                        memcpy(pvVar19,puVar15,rbytes);
                        pvVar19 = (void *)((long)pvVar19 + rbytes);
                      }
                      uVar18 = si_00[1].ci.numFolders;
                      p_Var22 = (_7z_coder *)si_00[1].ss.unpack_streams;
                      for (uVar28 = 0; uVar17 = (ulong)uVar28, uVar17 < uVar18; uVar28 = uVar28 + 1)
                      {
                        (&local_70->coders)[uVar17 * 0xb] = p_Var22;
                        uVar30 = 0;
                        uVar32 = uVar38;
                        p_Var23 = p_Var22;
                        while( true ) {
                          p_Var22 = (_7z_coder *)((long)&p_Var23->codec + 2);
                          if (uVar32 < 2) goto LAB_00159d20;
                          if (((char)p_Var23->codec == '\0') &&
                             (*(undefined1 *)((long)&p_Var23->codec + 1) == '\0')) break;
                          uVar32 = uVar32 - 2;
                          uVar30 = uVar30 + 2;
                          p_Var23 = p_Var22;
                        }
                        (&local_70->numCoders)[uVar17 * 0xb] = uVar30;
                        uVar38 = (uVar38 - uVar30) - 2;
                      }
                      break;
                    case '\x12':
                    case '\x13':
                    case '\x14':
                      pvVar19 = a->format->data;
                      lVar36 = *(long *)((long)pvVar19 + 0xa0);
                      puVar15 = (uchar *)calloc(*(size_t *)((long)pvVar19 + 0x98),1);
                      if (puVar15 == (uchar *)0x0) goto LAB_00159d20;
                      puVar20 = header_bytes(a,1);
                      if (puVar20 != (uchar *)0x0) {
                        if (*puVar20 == '\0') {
                          iVar8 = read_Bools(a,puVar15,*(size_t *)((long)pvVar19 + 0x98));
                          if (iVar8 < 0) goto LAB_00159d18;
                        }
                        else {
                          memset(puVar15,1,*(size_t *)((long)pvVar19 + 0x98));
                        }
                        puVar20 = header_bytes(a,1);
                        if ((puVar20 != (uchar *)0x0) &&
                           ((*puVar20 == '\0' ||
                            ((iVar8 = parse_7zip_uint64(a,&header.dataIndex), -1 < iVar8 &&
                             (header.dataIndex < 0xf4241)))))) {
                          for (uVar28 = 0; uVar38 = (ulong)uVar28,
                              uVar38 < *(ulong *)((long)pvVar19 + 0x98); uVar28 = uVar28 + 1) {
                            if (puVar15[uVar38] != '\0') {
                              puVar16 = (ulong *)header_bytes(a,8);
                              if (puVar16 == (ulong *)0x0) goto LAB_00159d18;
                              if (uVar5 == '\x14') {
                                if (*puVar16 < 0x19db1ded53e8000) {
                                  uVar18 = 0;
                                  lVar21 = 0;
                                }
                                else {
                                  uVar17 = *puVar16 + 0xfe624e212ac18000;
                                  uVar18 = uVar17 / 10000000;
                                  lVar21 = (uVar17 % 10000000) * 100;
                                }
                                lVar25 = uVar38 * 0x58 + lVar36;
                                *(ulong *)(lVar25 + 0x20) = uVar18;
                                *(long *)(lVar25 + 0x38) = lVar21;
                                uVar31 = 1;
                              }
                              else if (uVar5 == '\x13') {
                                if (*puVar16 < 0x19db1ded53e8000) {
                                  uVar18 = 0;
                                  lVar21 = 0;
                                }
                                else {
                                  uVar17 = *puVar16 + 0xfe624e212ac18000;
                                  uVar18 = uVar17 / 10000000;
                                  lVar21 = (uVar17 % 10000000) * 100;
                                }
                                lVar25 = uVar38 * 0x58 + lVar36;
                                *(ulong *)(lVar25 + 0x28) = uVar18;
                                *(long *)(lVar25 + 0x40) = lVar21;
                                uVar31 = 2;
                              }
                              else {
                                if (uVar5 != '\x12') goto LAB_00159a07;
                                if (*puVar16 < 0x19db1ded53e8000) {
                                  uVar18 = 0;
                                  lVar21 = 0;
                                }
                                else {
                                  uVar17 = *puVar16 + 0xfe624e212ac18000;
                                  uVar18 = uVar17 / 10000000;
                                  lVar21 = (uVar17 % 10000000) * 100;
                                }
                                lVar25 = uVar38 * 0x58 + lVar36;
                                *(ulong *)(lVar25 + 0x30) = uVar18;
                                *(long *)(lVar25 + 0x48) = lVar21;
                                uVar31 = 4;
                              }
                              puVar2 = (uint *)(lVar36 + 0x18 + uVar38 * 0x58);
                              *puVar2 = *puVar2 | uVar31;
                            }
LAB_00159a07:
                          }
                          free(puVar15);
                          break;
                        }
                      }
LAB_00159d18:
                      free(puVar15);
                      goto LAB_00159d20;
                    case '\x15':
                      puVar15 = header_bytes(a,2);
                      if (puVar15 == (uchar *)0x0) goto LAB_00159d20;
                      uVar5 = *puVar15;
                      sVar4 = val->numFolders;
                      puVar15 = (uchar *)calloc(sVar4,1);
                      header.attrBools = puVar15;
                      if (puVar15 == (uchar *)0x0) goto LAB_00159d20;
                      if (uVar5 == '\0') {
                        iVar8 = read_Bools(a,puVar15,sVar4);
                        if (iVar8 < 0) goto LAB_00159d20;
                      }
                      else {
                        memset(puVar15,1,sVar4);
                      }
                      for (uVar28 = 0; uVar38 = (ulong)uVar28, uVar38 < val->numFolders;
                          uVar28 = uVar28 + 1) {
                        if (puVar15[uVar38] != '\0') {
                          puVar20 = header_bytes(a,4);
                          if (puVar20 == (uchar *)0x0) goto LAB_00159d20;
                          *(undefined4 *)((long)&local_70->numUnpackStreams + uVar38 * 0x58 + 4) =
                               *(undefined4 *)puVar20;
                        }
                      }
                    }
                  } while( true );
                }
              }
            }
          }
        }
LAB_00159d20:
        if (*piVar13 == 0xc) {
          pcVar24 = "Couldn\'t allocate memory";
        }
        else {
          pcVar24 = "Damaged 7-Zip archive";
        }
        goto LAB_00159f79;
      }
      bVar39 = false;
      archive_set_error(&a->archive,-1,"Unexpected Property ID = %X");
    }
  }
LAB_0015906e:
  free(header.emptyStreamBools);
  free(header.emptyFileBools);
  free(header.antiBools);
  free(header.attrBools);
  if (!bVar39) {
    return iVar8;
  }
  puVar10 = (uint64_t *)si[1].ci.numFolders;
  p_Var34 = si[1].ci.folders;
  si[1].pi.positions = puVar10;
LAB_001590b9:
  si[1].ci.dataStreamIndex = (uint64_t)p_Var34;
  if (puVar10 == (uint64_t *)0x0) {
    iVar8 = 1;
  }
  else {
    si[1].pi.positions = (uint64_t *)((long)puVar10 + -1);
    si[1].ss.unpackSizes = (uint64_t *)0x0;
    *(undefined1 *)&si[2].pi.pos = 0;
    puVar11 = (uint32_t *)crc32(0,0,0);
    si[1].ss.digests = puVar11;
    if (si[0xc5].ss.unpackSizes == (uint64_t *)0x0) {
      paVar12 = archive_string_conversion_from_charset(&a->archive,"UTF-16LE",L'\x01');
      si[0xc5].ss.unpackSizes = (uint64_t *)paVar12;
      if (paVar12 == (archive_string_conv *)0x0) {
        return -0x1e;
      }
    }
    if (((p_Var34 != (_7z_folder *)0x0) &&
        (uVar38 = (ulong)(uint)p_Var34->numBindPairs, uVar38 < (si->ci).numFolders)) &&
       (p_Var26 = (si->ci).folders, p_Var26 != (_7z_folder *)0x0)) {
      p_Var26 = p_Var26 + uVar38;
      lVar36 = 0;
      for (uVar38 = 0; uVar38 < p_Var26->numCoders; uVar38 = uVar38 + 1) {
        lVar21 = *(long *)((long)&p_Var26->coders->codec + lVar36);
        if (((lVar21 == 0x6f10101) || (lVar21 == 0x6f10701)) || (lVar21 == 0x6f10303)) {
          archive_entry_set_is_data_encrypted(entry,'\x01');
          *(undefined4 *)&si[0xc6].ci.numFolders = 1;
        }
        lVar36 = lVar36 + 0x28;
      }
    }
    if ((int)si[0xc6].ci.numFolders == -1) {
      *(undefined4 *)&si[0xc6].ci.numFolders = 0;
    }
    wVar6 = _archive_entry_copy_pathname_l
                      (entry,(char *)p_Var34->coders,p_Var34->numCoders,
                       (archive_string_conv *)si[0xc5].ss.unpackSizes);
    if (wVar6 == L'\0') {
      iVar8 = 0;
    }
    else {
      piVar13 = __errno_location();
      if (*piVar13 == 0xc) {
        pcVar24 = "Can\'t allocate memory for Pathname";
LAB_00159390:
        archive_set_error(&a->archive,0xc,pcVar24);
        return -0x1e;
      }
      pcVar24 = archive_string_conversion_charset_name
                          ((archive_string_conv *)si[0xc5].ss.unpackSizes);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                        pcVar24);
      iVar8 = -0x14;
    }
    archive_entry_set_mode(entry,(mode_t)p_Var34->numUnpackStreams);
    uVar28 = *(uint *)&p_Var34->bindPairs;
    if ((uVar28 & 1) != 0) {
      archive_entry_set_mtime(entry,p_Var34->numPackedStreams,p_Var34->numOutStreams);
      uVar28 = *(uint *)&p_Var34->bindPairs;
    }
    if ((uVar28 & 4) != 0) {
      lVar36._0_1_ = p_Var34->digest_defined;
      lVar36._1_3_ = *(undefined3 *)&p_Var34->field_0x49;
      lVar36._4_4_ = p_Var34->digest;
      archive_entry_set_ctime(entry,p_Var34->numInStreams,lVar36);
      uVar28 = *(uint *)&p_Var34->bindPairs;
    }
    if ((uVar28 & 2) != 0) {
      archive_entry_set_atime(entry,(time_t)p_Var34->packedStreams,(long)p_Var34->unPackSize);
    }
    uVar38 = (ulong)*(uint *)((long)&p_Var34->numBindPairs + 4);
    if (uVar38 == 0xffffffff) {
      puVar15 = (uchar *)0x0;
    }
    else {
      puVar15 = (uchar *)(si->ss).unpackSizes[uVar38];
    }
    si[1].ss.digestsDefined = puVar15;
    archive_entry_set_size(entry,(int64_t)puVar15);
    puVar15 = si[1].ss.digestsDefined;
    if (puVar15 == (uchar *)0x0) {
      *(undefined1 *)&si[2].pi.pos = 1;
    }
    if ((p_Var34->numUnpackStreams & 0xf000) == 0xa000) {
      lVar36 = 0;
      pcVar24 = (char *)0x0;
      while (puVar15 != (uchar *)0x0) {
        iVar7 = archive_read_format_7zip_read_data(a,(void **)&header,&size,&offset);
        uVar30 = size;
        if (iVar7 < -0x14) {
          free(pcVar24);
          return iVar7;
        }
        pcVar14 = (char *)realloc(pcVar24,size + lVar36 + 1);
        if (pcVar14 == (char *)0x0) {
          free(pcVar24);
          pcVar24 = "Can\'t allocate memory for Symname";
          goto LAB_00159390;
        }
        memcpy(pcVar14 + lVar36,(void *)header.dataIndex,uVar30);
        lVar36 = lVar36 + uVar30;
        pcVar24 = pcVar14;
        puVar15 = si[1].ss.digestsDefined;
      }
      if (lVar36 == 0) {
        uVar28 = (uint)p_Var34->numUnpackStreams & 0xffff0fff | 0x8000;
        *(uint *)&p_Var34->numUnpackStreams = uVar28;
        archive_entry_set_mode(entry,uVar28);
      }
      else {
        pcVar24[lVar36] = '\0';
        archive_entry_copy_symlink(entry,pcVar24);
      }
      free(pcVar24);
      archive_entry_set_size(entry,0);
    }
    *(undefined2 *)((long)&si[0xc5].ss.digestsDefined + 4) = 0x70;
    *(undefined4 *)&si[0xc5].ss.digestsDefined = 0x695a2d37;
    (a->archive).archive_format_name = (char *)&si[0xc5].ss.digestsDefined;
  }
  return iVar8;
LAB_00159d73:
  uVar38 = (ulong)uVar31;
  if (val->numFolders <= uVar38) goto LAB_00159f52;
  if ((header.emptyStreamBools == (uchar *)0x0) || (header.emptyStreamBools[uVar38] == '\0')) {
    uVar29 = *(uint *)(&local_70->bindPairs + uVar38 * 0xb) | 0x10;
    *(uint *)(&local_70->bindPairs + uVar38 * 0xb) = uVar29;
  }
  else {
    uVar29 = *(uint *)(&local_70->bindPairs + uVar38 * 0xb);
  }
  puVar10 = &local_70->numCoders + uVar38 * 0xb;
  uVar27 = *(uint *)((long)&local_70->numUnpackStreams + uVar38 * 0x58 + 4);
  uVar37 = uVar27 >> 0x10;
  *(uint *)(&local_70->numUnpackStreams + uVar38 * 0xb) = uVar37;
  if ((uVar29 & 0x10) == 0) {
    if (header.emptyFileBools == (uchar *)0x0) {
      if (0xffff < uVar27) {
        bVar39 = false;
        goto LAB_00159e6c;
      }
LAB_00159e61:
      *(undefined4 *)(puVar10 + 10) = 0x41ff;
LAB_00159ea3:
      uVar38 = *puVar10;
      if ((1 < uVar38) &&
         ((p_Var22 = (_7z_coder *)puVar10[1], *(char *)((long)p_Var22 + (uVar38 - 2)) != '/' ||
          (*(char *)((long)p_Var22 + (uVar38 - 1)) != '\0')))) {
        *(undefined1 *)((long)&p_Var22->codec + uVar38) = 0x2f;
        *(undefined1 *)((long)&((_7z_coder *)puVar10[1])->codec + *puVar10 + 1) = 0;
        *puVar10 = *puVar10 + 2;
        uVar27 = *(uint *)((long)puVar10 + 0x54);
      }
    }
    else {
      lVar36 = (long)iVar8;
      bVar39 = header.emptyFileBools[lVar36] != '\0';
      iVar8 = iVar8 + 1;
      if (uVar27 < 0x10000) {
        if (header.emptyFileBools[lVar36] == '\0') goto LAB_00159e61;
        *(undefined4 *)(puVar10 + 10) = 0x81b6;
      }
      else {
LAB_00159e6c:
        if (((uVar27 & 0xf0000000) != 0x40000000) && (!bVar39)) {
          uVar37 = uVar37 & 0xfff | 0x4000;
          *(uint *)(puVar10 + 10) = uVar37;
        }
        if ((uVar37 & 0xf000) == 0x4000) goto LAB_00159ea3;
      }
    }
    *(undefined4 *)((long)puVar10 + 0x14) = 0xffffffff;
  }
  else {
    if ((si_00->ss).unpack_streams <= (ulong)(long)iVar7) goto LAB_00159d20;
    if (uVar27 < 0x10000) {
      *(undefined4 *)(puVar10 + 10) = 0x81b6;
    }
    if ((si_00->ss).digestsDefined[iVar7] != '\0') {
      *(uint *)(puVar10 + 3) = uVar29 | 8;
    }
    *(int *)((long)puVar10 + 0x14) = iVar7;
    iVar7 = iVar7 + 1;
  }
  if ((uVar27 & 1) != 0) {
    *(byte *)(puVar10 + 10) = (byte)puVar10[10] & 0x6d;
  }
  if (((ulong)puVar10[3] & 0x10) == 0 && uVar33 == 0) {
    *(undefined4 *)(puVar10 + 2) = 0xffffffff;
    uVar33 = 0;
  }
  else {
    if (uVar33 == 0) {
      while( true ) {
        if ((si_00->ci).numFolders <= (ulong)uVar28) goto LAB_00159d20;
        if (p_Var34[uVar28].numUnpackStreams != 0) break;
        uVar28 = uVar28 + 1;
      }
    }
    *(uint *)(puVar10 + 2) = uVar28;
    if (((ulong)puVar10[3] & 0x10) != 0) {
      uVar33 = uVar33 + 1;
      uVar18 = (ulong)uVar33;
      uVar38 = p_Var34[uVar28].numUnpackStreams;
      if (uVar38 <= uVar18) {
        uVar33 = 0;
      }
      uVar28 = uVar28 + (uVar38 <= uVar18);
    }
  }
  uVar31 = uVar31 + 1;
  goto LAB_00159d73;
}

Assistant:

static int
archive_read_format_7zip_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	struct _7zip_entry *zip_entry;
	int r, ret = ARCHIVE_OK;
	struct _7z_folder *folder = 0;
	uint64_t fidx = 0;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "7-Zip";

	if (zip->entries == NULL) {
		struct _7z_header_info header;

		memset(&header, 0, sizeof(header));
		r = slurp_central_directory(a, zip, &header);
		free_Header(&header);
		if (r != ARCHIVE_OK)
			return (r);
		zip->entries_remaining = (size_t)zip->numFiles;
		zip->entry = zip->entries;
	} else {
		++zip->entry;
	}
	zip_entry = zip->entry;

	if (zip->entries_remaining <= 0)
		return ARCHIVE_EOF;
	--zip->entries_remaining;

	zip->entry_offset = 0;
	zip->end_of_entry = 0;
	zip->entry_crc32 = crc32(0, NULL, 0);

	/* Setup a string conversion for a filename. */
	if (zip->sconv == NULL) {
		zip->sconv = archive_string_conversion_from_charset(
		    &a->archive, "UTF-16LE", 1);
		if (zip->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	/* Figure out if the entry is encrypted by looking at the folder
	   that is associated to the current 7zip entry. If the folder
	   has a coder with a _7Z_CRYPTO codec then the folder is encrypted.
	   Hence the entry must also be encrypted. */
	if (zip_entry && zip_entry->folderIndex < zip->si.ci.numFolders) {
		folder = &(zip->si.ci.folders[zip_entry->folderIndex]);
		for (fidx=0; folder && fidx<folder->numCoders; fidx++) {
			switch(folder->coders[fidx].codec) {
				case _7Z_CRYPTO_MAIN_ZIP:
				case _7Z_CRYPTO_RAR_29:
				case _7Z_CRYPTO_AES_256_SHA_256: {
					archive_entry_set_is_data_encrypted(entry, 1);
					zip->has_encrypted_entries = 1;
					break;
				}
			}
		}
	}

	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (archive_entry_copy_pathname_l(entry,
	    (const char *)zip_entry->utf16name,
	    zip_entry->name_len, zip->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(zip->sconv));
		ret = ARCHIVE_WARN;
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	if (zip_entry->flg & MTIME_IS_SET)
		archive_entry_set_mtime(entry, zip_entry->mtime,
			zip_entry->mtime_ns);
	if (zip_entry->flg & CTIME_IS_SET)
		archive_entry_set_ctime(entry, zip_entry->ctime,
		    zip_entry->ctime_ns);
	if (zip_entry->flg & ATIME_IS_SET)
		archive_entry_set_atime(entry, zip_entry->atime,
		    zip_entry->atime_ns);
	if (zip_entry->ssIndex != (uint32_t)-1) {
		zip->entry_bytes_remaining =
		    zip->si.ss.unpackSizes[zip_entry->ssIndex];
		archive_entry_set_size(entry, zip->entry_bytes_remaining);
	} else {
		zip->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, 0);
	}

	/* If there's no body, force read_data() to return EOF immediately. */
	if (zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	if ((zip_entry->mode & AE_IFMT) == AE_IFLNK) {
		unsigned char *symname = NULL;
		size_t symsize = 0;

		/*
		 * Symbolic-name is recorded as its contents. We have to
		 * read the contents at this time.
		 */
		while (zip->entry_bytes_remaining > 0) {
			const void *buff;
			unsigned char *mem;
			size_t size;
			int64_t offset;

			r = archive_read_format_7zip_read_data(a, &buff,
				&size, &offset);
			if (r < ARCHIVE_WARN) {
				free(symname);
				return (r);
			}
			mem = realloc(symname, symsize + size + 1);
			if (mem == NULL) {
				free(symname);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symname");
				return (ARCHIVE_FATAL);
			}
			symname = mem;
			memcpy(symname+symsize, buff, size);
			symsize += size;
		}
		if (symsize == 0) {
			/* If there is no synname, handle it as a regular
			 * file. */
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFREG;
			archive_entry_set_mode(entry, zip_entry->mode);
		} else {
			symname[symsize] = '\0';
			archive_entry_copy_symlink(entry,
			    (const char *)symname);
		}
		free(symname);
		archive_entry_set_size(entry, 0);
	}

	/* Set up a more descriptive format name. */
	sprintf(zip->format_name, "7-Zip");
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}